

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::regrid_level_0_on_restart(Amr *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Geometry *pGVar5;
  pointer pAVar6;
  long *plVar7;
  type pAVar8;
  int iVar9;
  long in_RDI;
  AmrLevel *a;
  DistributionMapping dm;
  Box result;
  BoxArray lev0;
  int dir;
  IntVect off;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  Print *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  int refinement_ratio;
  AmrMesh *in_stack_fffffffffffffac0;
  BoxArray *in_stack_fffffffffffffac8;
  BoxArray *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  uint uVar10;
  Print *in_stack_fffffffffffffae0;
  Box *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 uVar11;
  Print *this_00;
  undefined4 in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  int in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_49c;
  int local_498;
  int local_494;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int local_47c;
  int local_478;
  int local_474;
  int local_464;
  int local_460;
  int local_45c;
  int local_454;
  int local_450;
  int local_44c;
  int local_444;
  int local_440;
  int local_43c;
  bool local_409;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  ostream *in_stack_fffffffffffffc78;
  AmrCore *in_stack_fffffffffffffc80;
  undefined1 local_278 [32];
  int local_258 [2];
  int local_250;
  int local_248 [2];
  int local_240;
  undefined8 local_23c;
  undefined8 local_234;
  undefined8 local_22c;
  uint local_224;
  undefined1 local_220 [116];
  int local_1ac;
  int local_1a8;
  undefined4 local_1a4;
  Box *local_1a0;
  int local_198 [2];
  int local_190;
  undefined4 local_184;
  IntVect *local_180;
  IntVect local_174;
  int local_168;
  IntVect local_164;
  int *local_158;
  undefined8 *local_150;
  int local_144;
  long local_140;
  int local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  IntVect *local_118;
  long local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  IntVect *local_e0;
  int *local_d8;
  long local_d0;
  int *local_c8;
  long local_c0;
  int *local_b8;
  undefined8 *local_b0;
  uint *local_a8;
  int local_9c;
  uint *local_98;
  undefined4 local_90;
  int local_8c;
  IntVect *local_88;
  int local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  uint *local_10;
  int local_4;
  
  refinement_ratio = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  (anonymous_namespace)::regrid_on_restart = 0;
  pGVar5 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  local_1a0 = Geometry::Domain(pGVar5);
  local_1a4 = 2;
  local_23c = *(long *)(local_1a0->smallend).vect;
  local_234 = *(long *)((local_1a0->smallend).vect + 2);
  local_22c = *(long *)((local_1a0->bigend).vect + 1);
  local_224 = (local_1a0->btype).itype;
  IntVect::IntVect((IntVect *)(local_220 + 0x70),2);
  lVar3 = local_22c;
  lVar2 = local_234;
  lVar1 = local_23c;
  local_150 = &local_23c;
  local_158 = (int *)(local_220 + 0x70);
  local_124 = 1;
  local_409 = true;
  if ((local_220._112_4_ == 1) && (local_409 = true, local_1ac == 1)) {
    local_409 = local_1a8 != 1;
  }
  local_120 = local_158;
  if (local_409) {
    local_64 = (int)local_23c;
    local_60 = local_64;
    if (local_220._112_4_ != 1) {
      if (local_220._112_4_ == 2) {
        if ((int)local_23c < 0) {
          iVar9 = (int)local_23c + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_43c = -iVar9 / 2 + -1;
        }
        else {
          local_43c = (int)local_23c / 2;
        }
        local_60 = local_43c;
      }
      else if (local_220._112_4_ == 4) {
        if ((int)local_23c < 0) {
          iVar9 = (int)local_23c + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_440 = -iVar9 / 4 + -1;
        }
        else {
          local_440 = (int)local_23c / 4;
        }
        local_60 = local_440;
      }
      else {
        if ((int)local_23c < 0) {
          iVar9 = (int)local_23c + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_444 = -iVar9 / (int)local_220._112_4_ + -1;
        }
        else {
          local_444 = (int)local_23c / (int)local_220._112_4_;
        }
        local_60 = local_444;
      }
    }
    local_70 = local_23c._4_4_;
    local_23c._0_4_ = local_60;
    local_6c = local_70;
    if (local_1ac != 1) {
      if (local_1ac == 2) {
        if (lVar1 < 0) {
          iVar9 = local_70 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_44c = -iVar9 / 2 + -1;
        }
        else {
          local_44c = local_70 / 2;
        }
        local_6c = local_44c;
      }
      else if (local_1ac == 4) {
        if (lVar1 < 0) {
          iVar9 = local_70 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_450 = -iVar9 / 4 + -1;
        }
        else {
          local_450 = local_70 / 4;
        }
        local_6c = local_450;
      }
      else {
        if (lVar1 < 0) {
          iVar9 = local_70 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_454 = -iVar9 / local_1ac + -1;
        }
        else {
          local_454 = local_70 / local_1ac;
        }
        local_6c = local_454;
      }
    }
    local_23c._4_4_ = local_6c;
    local_7c = (int)local_234;
    local_78 = local_7c;
    if (local_1a8 != 1) {
      if (local_1a8 == 2) {
        if ((int)local_234 < 0) {
          iVar9 = (int)local_234 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_45c = -iVar9 / 2 + -1;
        }
        else {
          local_45c = (int)local_234 / 2;
        }
        local_78 = local_45c;
      }
      else if (local_1a8 == 4) {
        if ((int)local_234 < 0) {
          iVar9 = (int)local_234 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_460 = -iVar9 / 4 + -1;
        }
        else {
          local_460 = (int)local_234 / 4;
        }
        local_78 = local_460;
      }
      else {
        if ((int)local_234 < 0) {
          iVar9 = (int)local_234 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          local_464 = -iVar9 / local_1a8 + -1;
        }
        else {
          local_464 = (int)local_234 / local_1a8;
        }
        local_78 = local_464;
      }
    }
    local_4b4 = local_234._4_4_;
    local_234._0_4_ = local_78;
    local_a8 = &local_224;
    local_b8 = local_158;
    local_b0 = local_150;
    if (local_224 == 0) {
      local_c0 = (long)&local_234 + 4;
      local_40 = local_4b4;
      local_3c = local_40;
      if (local_220._112_4_ != 1) {
        if (local_220._112_4_ == 2) {
          if (lVar2 < 0) {
            local_4b4 = local_4b4 + 1;
            if (local_4b4 < 1) {
              local_4b4 = -local_4b4;
            }
            local_4ac = -local_4b4 / 2 + -1;
          }
          else {
            local_4ac = local_4b4 / 2;
          }
          local_3c = local_4ac;
        }
        else if (local_220._112_4_ == 4) {
          if (lVar2 < 0) {
            local_4b4 = local_4b4 + 1;
            if (local_4b4 < 1) {
              local_4b4 = -local_4b4;
            }
            local_4b0 = -local_4b4 / 4 + -1;
          }
          else {
            local_4b0 = local_4b4 / 4;
          }
          local_3c = local_4b0;
        }
        else {
          if (lVar2 < 0) {
            local_4b4 = local_4b4 + 1;
            if (local_4b4 < 1) {
              local_4b4 = -local_4b4;
            }
            local_4b4 = -local_4b4 / (int)local_220._112_4_ + -1;
          }
          else {
            local_4b4 = local_4b4 / (int)local_220._112_4_;
          }
          local_3c = local_4b4;
        }
      }
      local_234._4_4_ = local_3c;
      local_4c = (int)local_22c;
      local_48 = local_4c;
      if (local_1ac != 1) {
        if (local_1ac == 2) {
          if ((int)local_22c < 0) {
            iVar9 = (int)local_22c + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_4bc = -iVar9 / 2 + -1;
          }
          else {
            local_4bc = (int)local_22c / 2;
          }
          local_48 = local_4bc;
        }
        else if (local_1ac == 4) {
          if ((int)local_22c < 0) {
            iVar9 = (int)local_22c + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_4c0 = -iVar9 / 4 + -1;
          }
          else {
            local_4c0 = (int)local_22c / 4;
          }
          local_48 = local_4c0;
        }
        else {
          if ((int)local_22c < 0) {
            iVar9 = (int)local_22c + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_4c4 = -iVar9 / local_1ac + -1;
          }
          else {
            local_4c4 = (int)local_22c / local_1ac;
          }
          local_48 = local_4c4;
        }
      }
      local_58 = local_22c._4_4_;
      local_22c._0_4_ = local_48;
      local_54 = local_58;
      if (local_1a8 != 1) {
        if (local_1a8 == 2) {
          if (lVar3 < 0) {
            iVar9 = local_58 + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            in_stack_fffffffffffffb34 = -iVar9 / 2 + -1;
            local_54 = in_stack_fffffffffffffb34;
          }
          else {
            in_stack_fffffffffffffb34 = local_58 / 2;
            local_54 = in_stack_fffffffffffffb34;
          }
        }
        else if (local_1a8 == 4) {
          if (lVar3 < 0) {
            iVar9 = local_58 + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            in_stack_fffffffffffffb30 = -iVar9 / 4 + -1;
            local_54 = in_stack_fffffffffffffb30;
          }
          else {
            in_stack_fffffffffffffb30 = local_58 / 4;
            local_54 = in_stack_fffffffffffffb30;
          }
        }
        else if (lVar3 < 0) {
          iVar9 = local_58 + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          in_stack_fffffffffffffb2c = -iVar9 / local_1a8 + -1;
          local_54 = in_stack_fffffffffffffb2c;
        }
        else {
          in_stack_fffffffffffffb2c = local_58 / local_1a8;
          local_54 = in_stack_fffffffffffffb2c;
        }
      }
      local_22c._4_4_ = local_54;
      local_c8 = local_158;
    }
    else {
      IntVect::IntVect(&local_164,0);
      lVar1 = local_22c;
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        local_98 = &local_224;
        local_9c = local_168;
        local_14 = local_168;
        local_4 = local_168;
        if ((local_224 & 1 << ((byte)local_168 & 0x1f)) != 0) {
          local_140 = (long)&local_234 + 4;
          local_144 = local_168;
          local_130 = local_158;
          local_134 = local_168;
          if (*(int *)(local_140 + (long)local_168 * 4) % local_158[local_168] != 0) {
            local_88 = &local_164;
            local_8c = local_168;
            local_90 = 1;
            local_88->vect[local_168] = 1;
          }
        }
        local_10 = local_98;
      }
      local_d0 = (long)&local_234 + 4;
      local_d8 = local_158;
      local_1c = local_234._4_4_;
      local_20 = *local_158;
      local_18 = local_1c;
      if (local_20 != 1) {
        if (local_20 == 2) {
          if (local_234 < 0) {
            iVar9 = local_234._4_4_ + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_474 = -iVar9 / 2 + -1;
          }
          else {
            local_474 = local_234._4_4_ / 2;
          }
          local_18 = local_474;
        }
        else if (local_20 == 4) {
          if (local_234 < 0) {
            iVar9 = local_234._4_4_ + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_478 = -iVar9 / 4 + -1;
          }
          else {
            local_478 = local_234._4_4_ / 4;
          }
          local_18 = local_478;
        }
        else {
          if (local_234 < 0) {
            iVar9 = local_234._4_4_ + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_47c = -iVar9 / local_20 + -1;
          }
          else {
            local_47c = local_234._4_4_ / local_20;
          }
          local_18 = local_47c;
        }
      }
      local_234._4_4_ = local_18;
      local_28 = (int)local_22c;
      local_2c = local_158[1];
      local_24 = local_28;
      if (local_2c != 1) {
        if (local_2c == 2) {
          if ((int)local_22c < 0) {
            iVar9 = (int)local_22c + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            in_stack_fffffffffffffb7c = -iVar9 / 2 + -1;
            local_24 = in_stack_fffffffffffffb7c;
          }
          else {
            in_stack_fffffffffffffb7c = (int)local_22c / 2;
            local_24 = in_stack_fffffffffffffb7c;
          }
        }
        else if (local_2c == 4) {
          if ((int)local_22c < 0) {
            iVar9 = (int)local_22c + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            in_stack_fffffffffffffb78 = -iVar9 / 4 + -1;
            local_24 = in_stack_fffffffffffffb78;
          }
          else {
            in_stack_fffffffffffffb78 = (int)local_22c / 4;
            local_24 = in_stack_fffffffffffffb78;
          }
        }
        else if ((int)local_22c < 0) {
          iVar9 = (int)local_22c + 1;
          if (iVar9 < 1) {
            iVar9 = -iVar9;
          }
          in_stack_fffffffffffffb74 = -iVar9 / local_2c + -1;
          local_24 = in_stack_fffffffffffffb74;
        }
        else {
          in_stack_fffffffffffffb74 = (int)local_22c / local_2c;
          local_24 = in_stack_fffffffffffffb74;
        }
      }
      local_34 = local_22c._4_4_;
      local_22c._0_4_ = local_24;
      in_stack_fffffffffffffb70 = local_158[2];
      local_30 = local_34;
      if (in_stack_fffffffffffffb70 != 1) {
        if (in_stack_fffffffffffffb70 == 2) {
          if (lVar1 < 0) {
            iVar9 = local_34 + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_494 = -iVar9 / 2 + -1;
          }
          else {
            local_494 = local_34 / 2;
          }
          local_30 = local_494;
        }
        else if (in_stack_fffffffffffffb70 == 4) {
          if (lVar1 < 0) {
            iVar9 = local_34 + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_498 = -iVar9 / 4 + -1;
          }
          else {
            local_498 = local_34 / 4;
          }
          local_30 = local_498;
        }
        else {
          if (lVar1 < 0) {
            iVar9 = local_34 + 1;
            if (iVar9 < 1) {
              iVar9 = -iVar9;
            }
            local_49c = -iVar9 / in_stack_fffffffffffffb70 + -1;
          }
          else {
            local_49c = local_34 / in_stack_fffffffffffffb70;
          }
          local_30 = local_49c;
        }
      }
      local_22c._4_4_ = local_30;
      local_110 = (long)&local_234 + 4;
      local_118 = &local_164;
      local_e4 = 0;
      local_234._4_4_ = local_164.vect[0] + local_234._4_4_;
      local_f4 = 1;
      iVar9 = local_22c._4_4_;
      local_22c._0_4_ = local_164.vect[1] + (int)local_22c;
      local_104 = 2;
      local_22c._4_4_ = local_164.vect[2] + iVar9;
      local_100 = local_118;
      local_f0 = local_118;
      local_e0 = local_118;
      local_38 = in_stack_fffffffffffffb70;
    }
  }
  this_00 = (Print *)local_220;
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf0);
  local_180 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                        ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                         in_stack_fffffffffffffab0,
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  local_184 = 2;
  IntVect::IntVect(&local_174,local_180->vect[0] / 2,local_180->vect[1] / 2,local_180->vect[2] / 2);
  local_190 = local_174.vect[2];
  local_198[0] = local_174.vect[0];
  local_198[1] = local_174.vect[1];
  local_250 = local_174.vect[2];
  local_258[0] = local_174.vect[0];
  local_258[1] = local_174.vect[1];
  local_240 = local_174.vect[2];
  local_248[0] = local_174.vect[0];
  local_248[1] = local_174.vect[1];
  BoxArray::maxSize((BoxArray *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                    (IntVect *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  BoxArray::refine((BoxArray *)in_stack_fffffffffffffac0,refinement_ratio);
  if ((anonymous_namespace)::use_efficient_regrid == 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_fffffffffffffab0,
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    pAVar6 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x138e2ad);
    AmrLevel::boxArray(pAVar6);
    bVar4 = BoxArray::operator==(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    if (bVar4) {
      if (0 < *(int *)(in_RDI + 8)) {
        in_stack_fffffffffffffab0 = (Print *)OutStream();
        Print::Print(in_stack_fffffffffffffae0,
                     (ostream *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        Print::operator<<(in_stack_fffffffffffffab0,
                          (char (*) [44])
                          CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        Print::~Print(this_00);
      }
      goto LAB_0138e5ec;
    }
  }
  ParallelDescriptor::NProcs();
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
             (int)((ulong)in_stack_fffffffffffffac0 >> 0x20));
  plVar7 = *(long **)(in_RDI + 0x968);
  uVar11 = 0;
  pGVar5 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
  plVar7 = (long *)(**(code **)(*plVar7 + 0x30))
                             (*(undefined8 *)(in_RDI + 0x140),plVar7,in_RDI,uVar11,pGVar5,local_220,
                              local_278);
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffab0,
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  pAVar8 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator*
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      in_stack_fffffffffffffab0);
  (**(code **)(*plVar7 + 0xd8))(plVar7,pAVar8);
  uVar10 = 0;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffab0,
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
            ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
             in_stack_fffffffffffffab0,
             (pointer)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffab0,
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  pAVar6 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x138e3ec);
  AmrLevel::boxArray(pAVar6);
  AmrMesh::SetBoxArray
            (in_stack_fffffffffffffac0,refinement_ratio,(BoxArray *)in_stack_fffffffffffffab0);
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffab0,
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  pAVar6 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x138e41f);
  AmrLevel::DistributionMap(pAVar6);
  AmrMesh::SetDistributionMap
            (in_stack_fffffffffffffac0,refinement_ratio,
             (DistributionMapping *)in_stack_fffffffffffffab0);
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffab0,
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  pAVar6 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x138e452);
  (*pAVar6->_vptr_AmrLevel[0x13])(pAVar6,(ulong)uVar10);
  bVar4 = ParallelDescriptor::IOProcessor();
  if (bVar4) {
    if (*(int *)(in_RDI + 8) < 2) {
      if (0 < *(int *)(in_RDI + 8)) {
        OutStream();
        AmrCore::printGridSummary
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                   in_stack_fffffffffffffc70);
      }
    }
    else {
      OutStream();
      printGridInfo((Amr *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                    (ostream *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                    (int)((ulong)this_00 >> 0x20),(int)this_00);
    }
  }
  if ((*(int *)(in_RDI + 0x2c4) != 0) && (bVar4 = ParallelDescriptor::IOProcessor(), bVar4)) {
    printGridInfo((Amr *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                  (ostream *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                  (int)((ulong)this_00 >> 0x20),(int)this_00);
  }
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x138e572);
LAB_0138e5ec:
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffab0);
  return;
}

Assistant:

void
Amr::regrid_level_0_on_restart()
{
    regrid_on_restart = 0;
    //
    // Coarsening before we split the grids ensures that each resulting
    // grid will have an even number of cells in each direction.
    //
    BoxArray lev0(amrex::coarsen(Geom(0).Domain(),2));
    //
    // Now split up into list of grids within max_grid_size[0] limit.
    //
    lev0.maxSize(max_grid_size[0]/2);
    //
    // Now refine these boxes back to level 0.
    //
    lev0.refine(2);

    //
    // If use_efficient_regrid flag is set, then test to see whether we in fact
    //    have just changed the level 0 grids. If not, then don't do anything more here.
    //
    if ( !( (use_efficient_regrid == 1) && (lev0 == amr_level[0]->boxArray()) ) )
    {
        //
        // Construct skeleton of new level.
        //
        DistributionMapping dm(lev0);
        AmrLevel* a = (*levelbld)(*this,0,Geom(0),lev0,dm,cumtime);

        a->init(*amr_level[0]);
        amr_level[0].reset(a);

        this->SetBoxArray(0, amr_level[0]->boxArray());
        this->SetDistributionMap(0, amr_level[0]->DistributionMap());

        amr_level[0]->post_regrid(0,0);

        if (ParallelDescriptor::IOProcessor())
        {
            if (verbose > 1)
            {
                printGridInfo(amrex::OutStream(),0,finest_level);
            }
            else if (verbose > 0)
            {
                printGridSummary(amrex::OutStream(),0,finest_level);
            }
        }

        if (record_grid_info && ParallelDescriptor::IOProcessor())
            printGridInfo(gridlog,0,finest_level);
    }
    else
    {
        if (verbose > 0)
            amrex::Print() << "Regridding at level 0 but grids unchanged \n";
    }
}